

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::SharedDtor
          (UniDirectionalLSTMLayerParams *this)

{
  if (this != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_) {
    if (this->params_ != (LSTMParams *)0x0) {
      (*(this->params_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->weightparams_ != (LSTMWeightParams *)0x0) {
      (*(this->weightparams_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete params_;
  }
  if (this != internal_default_instance()) {
    delete weightparams_;
  }
}